

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int ecdh_sha2_nistp(LIBSSH2_SESSION *session,libssh2_curve_type type,uchar *data,size_t data_len,
                   uchar *public_key,size_t public_key_len,EVP_PKEY *private_key,
                   kmdhgGPshakex_state_t *exchange_state)

{
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  BIGNUM *pBVar9;
  size_t sVar10;
  LIBSSH2_HOSTKEY_METHOD *pLVar11;
  uchar *puVar12;
  uchar *puVar13;
  LIBSSH2_CRYPT_METHOD *pLVar14;
  _LIBSSH2_MAC_METHOD *p_Var15;
  LIBSSH2_COMP_METHOD *pLVar16;
  char *pcVar17;
  ulong uVar18;
  size_t sVar19;
  uchar *puVar20;
  size_t sVar21;
  uint32_t value;
  EVP_MD_CTX *fingerprint_ctx;
  libssh2_curve_type local_80;
  uint local_7c;
  uchar *local_78;
  size_t server_public_key_len;
  uchar *server_public_key;
  EVP_MD_CTX *hash;
  uchar *local_58;
  size_t local_50;
  void **local_48;
  size_t *local_40;
  uchar **local_38;
  
  if (data_len < 5) {
    iVar2 = _libssh2_error(session,-10,"Host key data is too short");
    return iVar2;
  }
  iVar2 = 0;
  local_80 = type;
  switch(exchange_state->state) {
  case libssh2_NB_state_idle:
    pBVar9 = BN_new();
    exchange_state->k = (BIGNUM *)pBVar9;
    exchange_state->state = libssh2_NB_state_created;
    break;
  default:
    goto switchD_0010bad6_caseD_1;
  case libssh2_NB_state_created:
    break;
  case libssh2_NB_state_sent:
    goto switchD_0010bad6_caseD_3;
  case libssh2_NB_state_sent2:
    goto switchD_0010bad6_caseD_5;
  }
  local_58 = data + 1;
  hash = (EVP_MD_CTX *)data;
  local_50 = data_len;
  iVar2 = _libssh2_copy_string
                    (session,(string_buf *)&hash,&session->server_hostkey,&server_public_key_len);
  if (iVar2 == 0) {
    session->server_hostkey_len = (uint32_t)server_public_key_len;
    iVar2 = _libssh2_sha1_init(&fingerprint_ctx);
    if ((iVar2 == 0) ||
       (iVar2 = _libssh2_sha1_update
                          (&fingerprint_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len), iVar2 == 0)) {
LAB_0010bb81:
      iVar8 = 0;
    }
    else {
      iVar2 = _libssh2_sha1_final(&fingerprint_ctx,session->server_hostkey_sha1);
      iVar8 = 1;
      if (iVar2 == 0) goto LAB_0010bb81;
    }
    session->server_hostkey_sha1_valid = iVar8;
    iVar2 = _libssh2_sha256_init(&fingerprint_ctx);
    if ((iVar2 == 0) ||
       (iVar2 = _libssh2_sha256_update
                          (&fingerprint_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len), iVar2 == 0)) {
LAB_0010bbce:
      iVar8 = 0;
    }
    else {
      iVar2 = _libssh2_sha256_final(&fingerprint_ctx,session->server_hostkey_sha256);
      iVar8 = 1;
      if (iVar2 == 0) goto LAB_0010bbce;
    }
    session->server_hostkey_sha256_valid = iVar8;
    ppvVar1 = &session->server_hostkey_abstract;
    iVar2 = (*session->hostkey->init)
                      (session,session->server_hostkey,(ulong)session->server_hostkey_len,ppvVar1);
    if (iVar2 == 0) {
      iVar2 = _libssh2_get_string((string_buf *)&hash,&server_public_key,&server_public_key_len);
      if (iVar2 == 0) {
        local_38 = &exchange_state->h_sig;
        iVar2 = _libssh2_get_string((string_buf *)&hash,local_38,&exchange_state->h_sig_len);
        if (iVar2 != 0) {
          pcVar17 = "Unexpected ECDH server sig length";
          goto LAB_0010bc07;
        }
        local_40 = &exchange_state->h_sig_len;
        iVar2 = _libssh2_ecdh_gen_k(&exchange_state->k,private_key,
                                    (uchar *)CONCAT44(server_public_key._4_4_,(int)server_public_key
                                                     ),
                                    CONCAT44(server_public_key_len._4_4_,
                                             (uint32_t)server_public_key_len));
        if (iVar2 != 0) {
          iVar2 = _libssh2_error(session,-5,"Unable to create ECDH shared secret");
          goto switchD_0010bad6_caseD_1;
        }
        iVar8 = BN_num_bits((BIGNUM *)exchange_state->k);
        iVar2 = iVar8 + 0xe;
        if (-1 < iVar8 + 7) {
          iVar2 = iVar8 + 7;
        }
        exchange_state->k_value_len = (long)((iVar2 >> 3) + 5);
        uVar3 = BN_num_bits((BIGNUM *)exchange_state->k);
        sVar19 = exchange_state->k_value_len;
        if ((uVar3 & 7) != 0) {
          sVar19 = sVar19 - 1;
          exchange_state->k_value_len = sVar19;
        }
        puVar12 = (uchar *)(*session->alloc)(sVar19,&session->abstract);
        exchange_state->k_value = puVar12;
        if (puVar12 == (uchar *)0x0) {
          iVar2 = _libssh2_error(session,-6,"Unable to allocate buffer for ECDH K");
          goto switchD_0010bad6_caseD_1;
        }
        _libssh2_htonu32(puVar12,(int)exchange_state->k_value_len - 4);
        uVar3 = BN_num_bits((BIGNUM *)exchange_state->k);
        if ((uVar3 & 7) == 0) {
          exchange_state->k_value[4] = '\0';
          iVar2 = BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + 5);
          if (iVar2 < 1) {
            pcVar17 = "Can\'t write exchange_state->e";
            goto LAB_0010bf88;
          }
        }
        else {
          iVar2 = BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + 4);
          if (iVar2 < 1) {
            pcVar17 = "Can\'t write exchange_state->k";
LAB_0010bf88:
            iVar2 = -0x29;
            goto LAB_0010c77c;
          }
        }
        value = (uint32_t)public_key_len;
        if (local_80 == LIBSSH2_EC_CURVE_NISTP521) {
          iVar8 = _libssh2_sha512_init(&fingerprint_ctx);
          iVar2 = -1;
          if (iVar8 != 0) {
            exchange_state->exchange_hash = &fingerprint_ctx;
            puVar12 = (session->local).banner;
            puVar13 = exchange_state->h_sig_comp;
            local_78 = puVar13;
            if (puVar12 == (uchar *)0x0) {
              local_48 = ppvVar1;
              _libssh2_htonu32(puVar13,0x1a);
              uVar3 = _libssh2_sha512_update(&fingerprint_ctx,puVar13,4);
              pcVar17 = "SSH-2.0-libssh2_1.11.2_DEV";
              sVar19 = 0x1a;
            }
            else {
              local_48 = ppvVar1;
              sVar10 = strlen((char *)puVar12);
              puVar12 = local_78;
              _libssh2_htonu32(local_78,(int)sVar10 - 2);
              uVar3 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
              pcVar17 = (char *)(session->local).banner;
              sVar10 = strlen(pcVar17);
              sVar19 = sVar10 - 2;
            }
            uVar4 = _libssh2_sha512_update(&fingerprint_ctx,pcVar17,sVar19);
            local_7c = uVar4 & uVar3 & 1;
            sVar10 = strlen((char *)(session->remote).banner);
            puVar13 = local_78;
            _libssh2_htonu32(local_78,(uint32_t)sVar10);
            uVar3 = _libssh2_sha512_update(&fingerprint_ctx,puVar13,4);
            puVar12 = (session->remote).banner;
            sVar10 = strlen((char *)puVar12);
            uVar4 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,sVar10);
            _libssh2_htonu32(puVar13,(uint32_t)(session->local).kexinit_len);
            uVar5 = _libssh2_sha512_update(&fingerprint_ctx,puVar13,4);
            uVar6 = _libssh2_sha512_update
                              (&fingerprint_ctx,(session->local).kexinit,
                               (session->local).kexinit_len);
            local_7c = uVar6 & uVar5 & uVar4 & uVar3 & local_7c;
            _libssh2_htonu32(puVar13,(uint32_t)(session->remote).kexinit_len);
            uVar3 = _libssh2_sha512_update(&fingerprint_ctx,puVar13,4);
            uVar4 = _libssh2_sha512_update
                              (&fingerprint_ctx,(session->remote).kexinit,
                               (session->remote).kexinit_len);
            _libssh2_htonu32(puVar13,session->server_hostkey_len);
            uVar5 = _libssh2_sha512_update(&fingerprint_ctx,puVar13,4);
            uVar6 = _libssh2_sha512_update
                              (&fingerprint_ctx,session->server_hostkey,
                               (ulong)session->server_hostkey_len);
            puVar12 = local_78;
            _libssh2_htonu32(local_78,value);
            uVar7 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
            uVar7 = uVar7 & uVar6 & uVar5 & uVar4 & uVar3 & local_7c;
            uVar3 = _libssh2_sha512_update(&fingerprint_ctx,public_key,public_key_len);
            _libssh2_htonu32(puVar12,(uint32_t)server_public_key_len);
            uVar4 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
            uVar5 = _libssh2_sha512_update
                              (&fingerprint_ctx,
                               (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                               CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len)
                              );
            uVar6 = _libssh2_sha512_update
                              (&fingerprint_ctx,exchange_state->k_value,exchange_state->k_value_len)
            ;
            if ((uVar5 & uVar4 & uVar3 & uVar7 & uVar6) == 0) {
LAB_0010c681:
              iVar2 = -1;
            }
            else {
              iVar8 = _libssh2_sha512_final(&fingerprint_ctx,local_78);
              iVar2 = -1;
              if (iVar8 != 0) {
                pLVar11 = session->hostkey;
                puVar12 = *local_38;
                sVar19 = *local_40;
                sVar21 = 0x40;
LAB_0010c669:
                iVar2 = (*pLVar11->sig_verify)(session,puVar12,sVar19,local_78,sVar21,local_48);
                iVar2 = -(uint)(iVar2 != 0);
              }
            }
          }
LAB_0010c68a:
          if (iVar2 != 0) {
            pcVar17 = "Unable to verify hostkey signature ECDH";
            iVar2 = -0xb;
            goto LAB_0010c77c;
          }
        }
        else {
          if (local_80 == LIBSSH2_EC_CURVE_NISTP384) {
            iVar8 = _libssh2_sha384_init(&fingerprint_ctx);
            iVar2 = -1;
            if (iVar8 != 0) {
              exchange_state->exchange_hash = &fingerprint_ctx;
              puVar12 = (session->local).banner;
              puVar13 = exchange_state->h_sig_comp;
              local_78 = puVar13;
              if (puVar12 == (uchar *)0x0) {
                local_48 = ppvVar1;
                _libssh2_htonu32(puVar13,0x1a);
                uVar3 = _libssh2_sha384_update(&fingerprint_ctx,puVar13,4);
                pcVar17 = "SSH-2.0-libssh2_1.11.2_DEV";
                sVar19 = 0x1a;
              }
              else {
                local_48 = ppvVar1;
                sVar10 = strlen((char *)puVar12);
                puVar12 = local_78;
                _libssh2_htonu32(local_78,(int)sVar10 - 2);
                uVar3 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
                pcVar17 = (char *)(session->local).banner;
                sVar10 = strlen(pcVar17);
                sVar19 = sVar10 - 2;
              }
              uVar4 = _libssh2_sha384_update(&fingerprint_ctx,pcVar17,sVar19);
              local_7c = uVar4 & uVar3 & 1;
              sVar10 = strlen((char *)(session->remote).banner);
              puVar13 = local_78;
              _libssh2_htonu32(local_78,(uint32_t)sVar10);
              uVar3 = _libssh2_sha384_update(&fingerprint_ctx,puVar13,4);
              puVar12 = (session->remote).banner;
              sVar10 = strlen((char *)puVar12);
              uVar4 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,sVar10);
              _libssh2_htonu32(puVar13,(uint32_t)(session->local).kexinit_len);
              uVar5 = _libssh2_sha384_update(&fingerprint_ctx,puVar13,4);
              uVar6 = _libssh2_sha384_update
                                (&fingerprint_ctx,(session->local).kexinit,
                                 (session->local).kexinit_len);
              local_7c = uVar6 & uVar5 & uVar4 & uVar3 & local_7c;
              _libssh2_htonu32(puVar13,(uint32_t)(session->remote).kexinit_len);
              uVar3 = _libssh2_sha384_update(&fingerprint_ctx,puVar13,4);
              uVar4 = _libssh2_sha384_update
                                (&fingerprint_ctx,(session->remote).kexinit,
                                 (session->remote).kexinit_len);
              _libssh2_htonu32(puVar13,session->server_hostkey_len);
              uVar5 = _libssh2_sha384_update(&fingerprint_ctx,puVar13,4);
              uVar6 = _libssh2_sha384_update
                                (&fingerprint_ctx,session->server_hostkey,
                                 (ulong)session->server_hostkey_len);
              puVar12 = local_78;
              _libssh2_htonu32(local_78,value);
              uVar7 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
              uVar7 = uVar7 & uVar6 & uVar5 & uVar4 & uVar3 & local_7c;
              uVar3 = _libssh2_sha384_update(&fingerprint_ctx,public_key,public_key_len);
              _libssh2_htonu32(puVar12,(uint32_t)server_public_key_len);
              uVar4 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
              uVar5 = _libssh2_sha384_update
                                (&fingerprint_ctx,
                                 (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                                 CONCAT44(server_public_key_len._4_4_,
                                          (uint32_t)server_public_key_len));
              uVar6 = _libssh2_sha384_update
                                (&fingerprint_ctx,exchange_state->k_value,
                                 exchange_state->k_value_len);
              if ((uVar5 & uVar4 & uVar3 & uVar7 & uVar6) == 0) goto LAB_0010c681;
              iVar8 = _libssh2_sha384_final(&fingerprint_ctx,local_78);
              iVar2 = -1;
              if (iVar8 != 0) {
                pLVar11 = session->hostkey;
                puVar12 = *local_38;
                sVar19 = *local_40;
                sVar21 = 0x30;
                goto LAB_0010c669;
              }
            }
            goto LAB_0010c68a;
          }
          if (local_80 == LIBSSH2_EC_CURVE_NISTP256) {
            iVar8 = _libssh2_sha256_init(&fingerprint_ctx);
            iVar2 = -1;
            if (iVar8 != 0) {
              exchange_state->exchange_hash = &fingerprint_ctx;
              puVar12 = (session->local).banner;
              puVar13 = exchange_state->h_sig_comp;
              local_78 = puVar13;
              if (puVar12 == (uchar *)0x0) {
                local_48 = ppvVar1;
                _libssh2_htonu32(puVar13,0x1a);
                uVar3 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
                pcVar17 = "SSH-2.0-libssh2_1.11.2_DEV";
                sVar19 = 0x1a;
              }
              else {
                local_48 = ppvVar1;
                sVar10 = strlen((char *)puVar12);
                puVar12 = local_78;
                _libssh2_htonu32(local_78,(int)sVar10 - 2);
                uVar3 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,4);
                pcVar17 = (char *)(session->local).banner;
                sVar10 = strlen(pcVar17);
                sVar19 = sVar10 - 2;
              }
              uVar4 = _libssh2_sha256_update(&fingerprint_ctx,pcVar17,sVar19);
              local_7c = uVar4 & uVar3 & 1;
              sVar10 = strlen((char *)(session->remote).banner);
              puVar13 = local_78;
              _libssh2_htonu32(local_78,(uint32_t)sVar10);
              uVar3 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
              puVar12 = (session->remote).banner;
              sVar10 = strlen((char *)puVar12);
              uVar4 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,sVar10);
              _libssh2_htonu32(puVar13,(uint32_t)(session->local).kexinit_len);
              uVar5 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
              uVar6 = _libssh2_sha256_update
                                (&fingerprint_ctx,(session->local).kexinit,
                                 (session->local).kexinit_len);
              local_7c = uVar6 & uVar5 & uVar4 & uVar3 & local_7c;
              _libssh2_htonu32(puVar13,(uint32_t)(session->remote).kexinit_len);
              uVar3 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
              uVar4 = _libssh2_sha256_update
                                (&fingerprint_ctx,(session->remote).kexinit,
                                 (session->remote).kexinit_len);
              _libssh2_htonu32(puVar13,session->server_hostkey_len);
              uVar5 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
              uVar6 = _libssh2_sha256_update
                                (&fingerprint_ctx,session->server_hostkey,
                                 (ulong)session->server_hostkey_len);
              puVar12 = local_78;
              _libssh2_htonu32(local_78,value);
              uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,4);
              uVar7 = uVar7 & uVar6 & uVar5 & uVar4 & uVar3 & local_7c;
              uVar3 = _libssh2_sha256_update(&fingerprint_ctx,public_key,public_key_len);
              _libssh2_htonu32(puVar12,(uint32_t)server_public_key_len);
              uVar4 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,4);
              uVar5 = _libssh2_sha256_update
                                (&fingerprint_ctx,
                                 (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                                 CONCAT44(server_public_key_len._4_4_,
                                          (uint32_t)server_public_key_len));
              uVar6 = _libssh2_sha256_update
                                (&fingerprint_ctx,exchange_state->k_value,
                                 exchange_state->k_value_len);
              if ((uVar5 & uVar4 & uVar3 & uVar7 & uVar6) == 0) goto LAB_0010c681;
              iVar8 = _libssh2_sha256_final(&fingerprint_ctx,local_78);
              iVar2 = -1;
              if (iVar8 != 0) {
                pLVar11 = session->hostkey;
                puVar12 = *local_38;
                sVar19 = *local_40;
                sVar21 = 0x20;
                goto LAB_0010c669;
              }
            }
            goto LAB_0010c68a;
          }
        }
        exchange_state->c = '\x15';
        exchange_state->state = libssh2_NB_state_sent;
switchD_0010bad6_caseD_3:
        iVar2 = _libssh2_transport_send(session,&exchange_state->c,1,(uchar *)0x0,0);
        if (iVar2 == -0x25) {
          return -0x25;
        }
        if (iVar2 == 0) {
          exchange_state->state = libssh2_NB_state_sent2;
switchD_0010bad6_caseD_5:
          iVar2 = _libssh2_packet_require
                            (session,'\x15',&exchange_state->tmp,&exchange_state->tmp_len,0,
                             (uchar *)0x0,0,&exchange_state->req_state);
          if (iVar2 == -0x25) {
            return -0x25;
          }
          if (iVar2 == 0) {
            *(byte *)&session->state = (byte)session->state | 4;
            (*session->free)(exchange_state->tmp,&session->abstract);
            if (session->session_id == (uchar *)0x0) {
              if (local_80 == LIBSSH2_EC_CURVE_NISTP256) {
                sVar19 = 0x20;
              }
              else if (local_80 == LIBSSH2_EC_CURVE_NISTP521) {
                sVar19 = 0x40;
              }
              else {
                if (local_80 != LIBSSH2_EC_CURVE_NISTP384) {
                  pcVar17 = "Unknown SHA digest for EC curve";
                  iVar2 = -5;
                  goto LAB_0010c77c;
                }
                sVar19 = 0x30;
              }
              puVar12 = (uchar *)(*session->alloc)(sVar19,&session->abstract);
              session->session_id = puVar12;
              if (puVar12 == (uchar *)0x0) {
                pcVar17 = "Unable to allocate buffer for SHA digest";
                goto LAB_0010bb25;
              }
              memcpy(puVar12,exchange_state->h_sig_comp,sVar19);
              session->session_id_len = (uint32_t)sVar19;
            }
            pLVar14 = (session->local).crypt;
            if (pLVar14->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
              (*pLVar14->dtor)(session,&(session->local).crypt_abstract);
              pLVar14 = (session->local).crypt;
            }
            if (pLVar14->init !=
                (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                 *)0x0) {
              server_public_key._0_4_ = 0;
              server_public_key_len._0_4_ = 0;
              if (local_80 == LIBSSH2_EC_CURVE_NISTP256) {
                puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x20,&session->abstract
                                                    );
                if (puVar12 == (uchar *)0x0) {
LAB_0010cb92:
                  puVar12 = (uchar *)0x0;
                }
                else if (((session->local).crypt)->iv_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha256_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha256_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                       iVar2 == 0)) goto LAB_0010cb84;
                    uVar18 = sVar19;
                    puVar13 = puVar12;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha256_update(&hash,"A",1);
                      if (iVar2 == 0) goto LAB_0010cb84;
                      uVar18 = (ulong)session->session_id_len;
                      puVar13 = session->session_id;
                    }
                    iVar2 = _libssh2_sha256_update(&hash,puVar13,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha256_final(&hash,puVar12 + sVar19), iVar2 == 0))
                    goto LAB_0010cb84;
                    sVar19 = sVar19 + 0x20;
                  } while (sVar19 < (ulong)(long)((session->local).crypt)->iv_len);
                }
              }
              else if (local_80 == LIBSSH2_EC_CURVE_NISTP521) {
                puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x40,&session->abstract
                                                    );
                if (puVar12 == (uchar *)0x0) goto LAB_0010cb92;
                if (((session->local).crypt)->iv_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha512_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha512_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40),
                       iVar2 == 0)) goto LAB_0010cb84;
                    uVar18 = sVar19;
                    puVar13 = puVar12;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha512_update(&hash,"A",1);
                      if (iVar2 == 0) goto LAB_0010cb84;
                      uVar18 = (ulong)session->session_id_len;
                      puVar13 = session->session_id;
                    }
                    iVar2 = _libssh2_sha512_update(&hash,puVar13,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha512_final(&hash,puVar12 + sVar19), iVar2 == 0))
                    goto LAB_0010cb84;
                    sVar19 = sVar19 + 0x40;
                  } while (sVar19 < (ulong)(long)((session->local).crypt)->iv_len);
                }
              }
              else {
                iVar2 = -1;
                if (local_80 != LIBSSH2_EC_CURVE_NISTP384) goto switchD_0010bad6_caseD_1;
                puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x30,&session->abstract
                                                    );
                if (puVar12 == (uchar *)0x0) goto LAB_0010cb92;
                if (((session->local).crypt)->iv_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha384_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha384_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30),
                       iVar2 == 0)) goto LAB_0010cb84;
                    uVar18 = sVar19;
                    puVar13 = puVar12;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha384_update(&hash,"A",1);
                      if (iVar2 == 0) goto LAB_0010cb84;
                      uVar18 = (ulong)session->session_id_len;
                      puVar13 = session->session_id;
                    }
                    iVar2 = _libssh2_sha384_update(&hash,puVar13,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha384_final(&hash,puVar12 + sVar19), iVar2 == 0))
                    goto LAB_0010cb84;
                    sVar19 = sVar19 + 0x30;
                  } while (sVar19 < (ulong)(long)((session->local).crypt)->iv_len);
                }
              }
              if (puVar12 == (uchar *)0x0) {
                iVar2 = -1;
                goto switchD_0010bad6_caseD_1;
              }
              if (local_80 == LIBSSH2_EC_CURVE_NISTP256) {
                puVar13 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len +
                                                     0x20,&session->abstract);
                if (puVar13 == (uchar *)0x0) {
LAB_0010cf05:
                  puVar13 = (uchar *)0x0;
                }
                else if (((session->local).crypt)->secret_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha256_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha256_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                       iVar2 == 0)) goto LAB_0010cef7;
                    uVar18 = sVar19;
                    puVar20 = puVar13;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha256_update(&hash,"C",1);
                      if (iVar2 == 0) goto LAB_0010cef7;
                      uVar18 = (ulong)session->session_id_len;
                      puVar20 = session->session_id;
                    }
                    iVar2 = _libssh2_sha256_update(&hash,puVar20,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha256_final(&hash,puVar13 + sVar19), iVar2 == 0))
                    goto LAB_0010cef7;
                    sVar19 = sVar19 + 0x20;
                  } while (sVar19 < (ulong)(long)((session->local).crypt)->secret_len);
                }
LAB_0010cf08:
                if (puVar13 != (uchar *)0x0) {
                  pLVar14 = (session->local).crypt;
                  iVar2 = (*pLVar14->init)(session,pLVar14,puVar12,(int *)&server_public_key,puVar13
                                           ,(int *)&server_public_key_len,1,
                                           &(session->local).crypt_abstract);
                  if (iVar2 == 0) {
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar12,(long)((session->local).crypt)->iv_len);
                      (*session->free)(puVar12,&session->abstract);
                    }
                    if ((uint32_t)server_public_key_len != 0) {
                      explicit_bzero(puVar13,(long)((session->local).crypt)->secret_len);
                      (*session->free)(puVar13,&session->abstract);
                    }
                    goto LAB_0010cfa7;
                  }
                  (*session->free)(puVar12,&session->abstract);
                  puVar12 = puVar13;
                }
              }
              else {
                if (local_80 == LIBSSH2_EC_CURVE_NISTP521) {
                  puVar13 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len +
                                                       0x40,&session->abstract);
                  if (puVar13 == (uchar *)0x0) goto LAB_0010cf05;
                  if (((session->local).crypt)->secret_len != 0) {
                    sVar19 = 0;
                    do {
                      iVar2 = _libssh2_sha512_init(&hash);
                      if (((iVar2 == 0) ||
                          (iVar2 = _libssh2_sha512_update
                                             (&hash,exchange_state->k_value,
                                              exchange_state->k_value_len), iVar2 == 0)) ||
                         (iVar2 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40),
                         iVar2 == 0)) goto LAB_0010cef7;
                      uVar18 = sVar19;
                      puVar20 = puVar13;
                      if (sVar19 == 0) {
                        iVar2 = _libssh2_sha512_update(&hash,"C",1);
                        if (iVar2 == 0) goto LAB_0010cef7;
                        uVar18 = (ulong)session->session_id_len;
                        puVar20 = session->session_id;
                      }
                      iVar2 = _libssh2_sha512_update(&hash,puVar20,uVar18);
                      if ((iVar2 == 0) ||
                         (iVar2 = _libssh2_sha512_final(&hash,puVar13 + sVar19), iVar2 == 0))
                      goto LAB_0010cef7;
                      sVar19 = sVar19 + 0x40;
                    } while (sVar19 < (ulong)(long)((session->local).crypt)->secret_len);
                  }
                  goto LAB_0010cf08;
                }
                if (local_80 == LIBSSH2_EC_CURVE_NISTP384) {
                  puVar13 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len +
                                                       0x30,&session->abstract);
                  if (puVar13 == (uchar *)0x0) goto LAB_0010cf05;
                  if (((session->local).crypt)->secret_len != 0) {
                    sVar19 = 0;
                    do {
                      iVar2 = _libssh2_sha384_init(&hash);
                      if (((iVar2 == 0) ||
                          (iVar2 = _libssh2_sha384_update
                                             (&hash,exchange_state->k_value,
                                              exchange_state->k_value_len), iVar2 == 0)) ||
                         (iVar2 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30),
                         iVar2 == 0)) goto LAB_0010cef7;
                      uVar18 = sVar19;
                      puVar20 = puVar13;
                      if (sVar19 == 0) {
                        iVar2 = _libssh2_sha384_update(&hash,"C",1);
                        if (iVar2 == 0) goto LAB_0010cef7;
                        uVar18 = (ulong)session->session_id_len;
                        puVar20 = session->session_id;
                      }
                      iVar2 = _libssh2_sha384_update(&hash,puVar20,uVar18);
                      if ((iVar2 == 0) ||
                         (iVar2 = _libssh2_sha384_final(&hash,puVar13 + sVar19), iVar2 == 0))
                      goto LAB_0010cef7;
                      sVar19 = sVar19 + 0x30;
                    } while (sVar19 < (ulong)(long)((session->local).crypt)->secret_len);
                  }
                  goto LAB_0010cf08;
                }
              }
              (*session->free)(puVar12,&session->abstract);
LAB_0010cf55:
              iVar2 = -5;
              goto switchD_0010bad6_caseD_1;
            }
LAB_0010cfa7:
            pLVar14 = (session->remote).crypt;
            if (pLVar14->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
              (*pLVar14->dtor)(session,&(session->remote).crypt_abstract);
              pLVar14 = (session->remote).crypt;
            }
            if (pLVar14->init !=
                (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                 *)0x0) {
              server_public_key._0_4_ = 0;
              server_public_key_len._0_4_ = 0;
              if (local_80 == LIBSSH2_EC_CURVE_NISTP256) {
                puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x20,&session->abstract
                                                    );
                if (puVar12 == (uchar *)0x0) {
LAB_0010d336:
                  puVar12 = (uchar *)0x0;
                }
                else if (((session->remote).crypt)->iv_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha256_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha256_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                       iVar2 == 0)) goto LAB_0010d328;
                    uVar18 = sVar19;
                    puVar13 = puVar12;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha256_update(&hash,"B",1);
                      if (iVar2 == 0) goto LAB_0010d328;
                      uVar18 = (ulong)session->session_id_len;
                      puVar13 = session->session_id;
                    }
                    iVar2 = _libssh2_sha256_update(&hash,puVar13,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha256_final(&hash,puVar12 + sVar19), iVar2 == 0))
                    goto LAB_0010d328;
                    sVar19 = sVar19 + 0x20;
                  } while (sVar19 < (ulong)(long)((session->remote).crypt)->iv_len);
                }
LAB_0010d342:
                if (puVar12 != (uchar *)0x0) {
                  if (local_80 == LIBSSH2_EC_CURVE_NISTP256) {
                    puVar13 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len
                                                         + 0x20,&session->abstract);
                    if (puVar13 == (uchar *)0x0) {
LAB_0010d6a4:
                      puVar13 = (uchar *)0x0;
                    }
                    else if (((session->remote).crypt)->secret_len != 0) {
                      sVar19 = 0;
                      do {
                        iVar2 = _libssh2_sha256_init(&hash);
                        if (((iVar2 == 0) ||
                            (iVar2 = _libssh2_sha256_update
                                               (&hash,exchange_state->k_value,
                                                exchange_state->k_value_len), iVar2 == 0)) ||
                           (iVar2 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                           iVar2 == 0)) goto LAB_0010d696;
                        uVar18 = sVar19;
                        puVar20 = puVar13;
                        if (sVar19 == 0) {
                          iVar2 = _libssh2_sha256_update(&hash,"D",1);
                          if (iVar2 == 0) goto LAB_0010d696;
                          uVar18 = (ulong)session->session_id_len;
                          puVar20 = session->session_id;
                        }
                        iVar2 = _libssh2_sha256_update(&hash,puVar20,uVar18);
                        if ((iVar2 == 0) ||
                           (iVar2 = _libssh2_sha256_final(&hash,puVar13 + sVar19), iVar2 == 0))
                        goto LAB_0010d696;
                        sVar19 = sVar19 + 0x20;
                      } while (sVar19 < (ulong)(long)((session->remote).crypt)->secret_len);
                    }
LAB_0010d6a7:
                    if (puVar13 != (uchar *)0x0) {
                      pLVar14 = (session->remote).crypt;
                      iVar2 = (*pLVar14->init)(session,pLVar14,puVar12,(int *)&server_public_key,
                                               puVar13,(int *)&server_public_key_len,0,
                                               &(session->remote).crypt_abstract);
                      if (iVar2 == 0) {
                        if ((int)server_public_key != 0) {
                          explicit_bzero(puVar12,(long)((session->remote).crypt)->iv_len);
                          (*session->free)(puVar12,&session->abstract);
                        }
                        if ((uint32_t)server_public_key_len != 0) {
                          explicit_bzero(puVar13,(long)((session->remote).crypt)->secret_len);
                          (*session->free)(puVar13,&session->abstract);
                        }
                        goto LAB_0010d74b;
                      }
                      (*session->free)(puVar12,&session->abstract);
                      puVar12 = puVar13;
                    }
                  }
                  else {
                    if (local_80 == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar13 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                 secret_len + 0x40,
                                                           &session->abstract);
                      if (puVar13 == (uchar *)0x0) goto LAB_0010d6a4;
                      if (((session->remote).crypt)->secret_len != 0) {
                        sVar19 = 0;
                        do {
                          iVar2 = _libssh2_sha512_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha512_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40),
                             iVar2 == 0)) goto LAB_0010d696;
                          uVar18 = sVar19;
                          puVar20 = puVar13;
                          if (sVar19 == 0) {
                            iVar2 = _libssh2_sha512_update(&hash,"D",1);
                            if (iVar2 == 0) goto LAB_0010d696;
                            uVar18 = (ulong)session->session_id_len;
                            puVar20 = session->session_id;
                          }
                          iVar2 = _libssh2_sha512_update(&hash,puVar20,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha512_final(&hash,puVar13 + sVar19), iVar2 == 0))
                          goto LAB_0010d696;
                          sVar19 = sVar19 + 0x40;
                        } while (sVar19 < (ulong)(long)((session->remote).crypt)->secret_len);
                      }
                      goto LAB_0010d6a7;
                    }
                    if (local_80 == LIBSSH2_EC_CURVE_NISTP384) {
                      puVar13 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                 secret_len + 0x30,
                                                           &session->abstract);
                      if (puVar13 == (uchar *)0x0) goto LAB_0010d6a4;
                      if (((session->remote).crypt)->secret_len != 0) {
                        sVar19 = 0;
                        do {
                          iVar2 = _libssh2_sha384_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha384_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30),
                             iVar2 == 0)) goto LAB_0010d696;
                          uVar18 = sVar19;
                          puVar20 = puVar13;
                          if (sVar19 == 0) {
                            iVar2 = _libssh2_sha384_update(&hash,"D",1);
                            if (iVar2 == 0) goto LAB_0010d696;
                            uVar18 = (ulong)session->session_id_len;
                            puVar20 = session->session_id;
                          }
                          iVar2 = _libssh2_sha384_update(&hash,puVar20,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha384_final(&hash,puVar13 + sVar19), iVar2 == 0))
                          goto LAB_0010d696;
                          sVar19 = sVar19 + 0x30;
                        } while (sVar19 < (ulong)(long)((session->remote).crypt)->secret_len);
                      }
                      goto LAB_0010d6a7;
                    }
                  }
                  (*session->free)(puVar12,&session->abstract);
                }
              }
              else {
                if (local_80 == LIBSSH2_EC_CURVE_NISTP521) {
                  puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x40,
                                                       &session->abstract);
                  if (puVar12 == (uchar *)0x0) goto LAB_0010d336;
                  if (((session->remote).crypt)->iv_len != 0) {
                    sVar19 = 0;
                    do {
                      iVar2 = _libssh2_sha512_init(&hash);
                      if (((iVar2 == 0) ||
                          (iVar2 = _libssh2_sha512_update
                                             (&hash,exchange_state->k_value,
                                              exchange_state->k_value_len), iVar2 == 0)) ||
                         (iVar2 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40),
                         iVar2 == 0)) goto LAB_0010d328;
                      uVar18 = sVar19;
                      puVar13 = puVar12;
                      if (sVar19 == 0) {
                        iVar2 = _libssh2_sha512_update(&hash,"B",1);
                        if (iVar2 == 0) goto LAB_0010d328;
                        uVar18 = (ulong)session->session_id_len;
                        puVar13 = session->session_id;
                      }
                      iVar2 = _libssh2_sha512_update(&hash,puVar13,uVar18);
                      if ((iVar2 == 0) ||
                         (iVar2 = _libssh2_sha512_final(&hash,puVar12 + sVar19), iVar2 == 0))
                      goto LAB_0010d328;
                      sVar19 = sVar19 + 0x40;
                    } while (sVar19 < (ulong)(long)((session->remote).crypt)->iv_len);
                  }
                  goto LAB_0010d342;
                }
                if (local_80 == LIBSSH2_EC_CURVE_NISTP384) {
                  puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x30,
                                                       &session->abstract);
                  if (puVar12 == (uchar *)0x0) {
LAB_0010dfed:
                    puVar12 = (uchar *)0x0;
                  }
                  else if (((session->remote).crypt)->iv_len != 0) {
                    sVar19 = 0;
                    do {
                      iVar2 = _libssh2_sha384_init(&hash);
                      if (((iVar2 == 0) ||
                          (iVar2 = _libssh2_sha384_update
                                             (&hash,exchange_state->k_value,
                                              exchange_state->k_value_len), iVar2 == 0)) ||
                         (iVar2 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30),
                         iVar2 == 0)) {
LAB_0010dfdf:
                        (*session->free)(puVar12,&session->abstract);
                        goto LAB_0010dfed;
                      }
                      uVar18 = sVar19;
                      puVar13 = puVar12;
                      if (sVar19 == 0) {
                        iVar2 = _libssh2_sha384_update(&hash,"B",1);
                        if (iVar2 == 0) goto LAB_0010dfdf;
                        uVar18 = (ulong)session->session_id_len;
                        puVar13 = session->session_id;
                      }
                      iVar2 = _libssh2_sha384_update(&hash,puVar13,uVar18);
                      if ((iVar2 == 0) ||
                         (iVar2 = _libssh2_sha384_final(&hash,puVar12 + sVar19), iVar2 == 0))
                      goto LAB_0010dfdf;
                      sVar19 = sVar19 + 0x30;
                    } while (sVar19 < (ulong)(long)((session->remote).crypt)->iv_len);
                  }
                  goto LAB_0010d342;
                }
              }
              iVar2 = -5;
              goto switchD_0010bad6_caseD_1;
            }
LAB_0010d74b:
            p_Var15 = (session->local).mac;
            if (p_Var15->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
              (*p_Var15->dtor)(session,&(session->local).mac_abstract);
              p_Var15 = (session->local).mac;
            }
            if (p_Var15->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0
               ) {
              server_public_key._0_4_ = 0;
              if (local_80 == LIBSSH2_EC_CURVE_NISTP521) {
                puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x40,
                                                     &session->abstract);
                if (puVar12 == (uchar *)0x0) {
LAB_0010dacf:
                  puVar12 = (uchar *)0x0;
                }
                else if (((session->local).mac)->key_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha512_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha512_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40),
                       iVar2 == 0)) goto LAB_0010dac1;
                    uVar18 = sVar19;
                    puVar13 = puVar12;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha512_update(&hash,"E",1);
                      if (iVar2 == 0) goto LAB_0010dac1;
                      uVar18 = (ulong)session->session_id_len;
                      puVar13 = session->session_id;
                    }
                    iVar2 = _libssh2_sha512_update(&hash,puVar13,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha512_final(&hash,puVar12 + sVar19), iVar2 == 0))
                    goto LAB_0010dac1;
                    sVar19 = sVar19 + 0x40;
                  } while (sVar19 < (ulong)(long)((session->local).mac)->key_len);
                }
              }
              else if (local_80 == LIBSSH2_EC_CURVE_NISTP384) {
                puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x30,
                                                     &session->abstract);
                if (puVar12 == (uchar *)0x0) goto LAB_0010dacf;
                if (((session->local).mac)->key_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha384_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha384_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30),
                       iVar2 == 0)) goto LAB_0010dac1;
                    uVar18 = sVar19;
                    puVar13 = puVar12;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha384_update(&hash,"E",1);
                      if (iVar2 == 0) goto LAB_0010dac1;
                      uVar18 = (ulong)session->session_id_len;
                      puVar13 = session->session_id;
                    }
                    iVar2 = _libssh2_sha384_update(&hash,puVar13,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha384_final(&hash,puVar12 + sVar19), iVar2 == 0))
                    goto LAB_0010dac1;
                    sVar19 = sVar19 + 0x30;
                  } while (sVar19 < (ulong)(long)((session->local).mac)->key_len);
                }
              }
              else {
                if (local_80 != LIBSSH2_EC_CURVE_NISTP256) goto LAB_0010cf55;
                puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x20,
                                                     &session->abstract);
                if (puVar12 == (uchar *)0x0) goto LAB_0010dacf;
                if (((session->local).mac)->key_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha256_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha256_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                       iVar2 == 0)) goto LAB_0010dac1;
                    uVar18 = sVar19;
                    puVar13 = puVar12;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha256_update(&hash,"E",1);
                      if (iVar2 == 0) goto LAB_0010dac1;
                      uVar18 = (ulong)session->session_id_len;
                      puVar13 = session->session_id;
                    }
                    iVar2 = _libssh2_sha256_update(&hash,puVar13,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha256_final(&hash,puVar12 + sVar19), iVar2 == 0))
                    goto LAB_0010dac1;
                    sVar19 = sVar19 + 0x20;
                  } while (sVar19 < (ulong)(long)((session->local).mac)->key_len);
                }
              }
              if (puVar12 == (uchar *)0x0) goto LAB_0010cf55;
              (*((session->local).mac)->init)
                        (session,puVar12,(int *)&server_public_key,&(session->local).mac_abstract);
              if ((int)server_public_key != 0) {
                explicit_bzero(puVar12,(long)((session->local).mac)->key_len);
                (*session->free)(puVar12,&session->abstract);
              }
            }
            p_Var15 = (session->remote).mac;
            if (p_Var15->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
              (*p_Var15->dtor)(session,&(session->remote).mac_abstract);
              p_Var15 = (session->remote).mac;
            }
            if (p_Var15->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0
               ) {
              server_public_key._0_4_ = 0;
              if (local_80 == LIBSSH2_EC_CURVE_NISTP521) {
                puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x40,
                                                     &session->abstract);
                if (puVar12 == (uchar *)0x0) {
LAB_0010dea5:
                  puVar12 = (uchar *)0x0;
                }
                else if (((session->remote).mac)->key_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha512_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha512_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40),
                       iVar2 == 0)) goto LAB_0010de97;
                    uVar18 = sVar19;
                    puVar13 = puVar12;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha512_update(&hash,"F",1);
                      if (iVar2 == 0) goto LAB_0010de97;
                      uVar18 = (ulong)session->session_id_len;
                      puVar13 = session->session_id;
                    }
                    iVar2 = _libssh2_sha512_update(&hash,puVar13,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha512_final(&hash,puVar12 + sVar19), iVar2 == 0))
                    goto LAB_0010de97;
                    sVar19 = sVar19 + 0x40;
                  } while (sVar19 < (ulong)(long)((session->remote).mac)->key_len);
                }
              }
              else if (local_80 == LIBSSH2_EC_CURVE_NISTP384) {
                puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x30,
                                                     &session->abstract);
                if (puVar12 == (uchar *)0x0) goto LAB_0010dea5;
                if (((session->remote).mac)->key_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha384_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha384_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30),
                       iVar2 == 0)) goto LAB_0010de97;
                    uVar18 = sVar19;
                    puVar13 = puVar12;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha384_update(&hash,"F",1);
                      if (iVar2 == 0) goto LAB_0010de97;
                      uVar18 = (ulong)session->session_id_len;
                      puVar13 = session->session_id;
                    }
                    iVar2 = _libssh2_sha384_update(&hash,puVar13,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha384_final(&hash,puVar12 + sVar19), iVar2 == 0))
                    goto LAB_0010de97;
                    sVar19 = sVar19 + 0x30;
                  } while (sVar19 < (ulong)(long)((session->remote).mac)->key_len);
                }
              }
              else {
                if (local_80 != LIBSSH2_EC_CURVE_NISTP256) goto LAB_0010cf55;
                puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x20,
                                                     &session->abstract);
                if (puVar12 == (uchar *)0x0) goto LAB_0010dea5;
                if (((session->remote).mac)->key_len != 0) {
                  sVar19 = 0;
                  do {
                    iVar2 = _libssh2_sha256_init(&hash);
                    if (((iVar2 == 0) ||
                        (iVar2 = _libssh2_sha256_update
                                           (&hash,exchange_state->k_value,
                                            exchange_state->k_value_len), iVar2 == 0)) ||
                       (iVar2 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                       iVar2 == 0)) goto LAB_0010de97;
                    uVar18 = sVar19;
                    puVar13 = puVar12;
                    if (sVar19 == 0) {
                      iVar2 = _libssh2_sha256_update(&hash,"F",1);
                      if (iVar2 == 0) goto LAB_0010de97;
                      uVar18 = (ulong)session->session_id_len;
                      puVar13 = session->session_id;
                    }
                    iVar2 = _libssh2_sha256_update(&hash,puVar13,uVar18);
                    if ((iVar2 == 0) ||
                       (iVar2 = _libssh2_sha256_final(&hash,puVar12 + sVar19), iVar2 == 0))
                    goto LAB_0010de97;
                    sVar19 = sVar19 + 0x20;
                  } while (sVar19 < (ulong)(long)((session->remote).mac)->key_len);
                }
              }
              if (puVar12 == (uchar *)0x0) goto LAB_0010cf55;
              (*((session->remote).mac)->init)
                        (session,puVar12,(int *)&server_public_key,&(session->remote).mac_abstract);
              if ((int)server_public_key != 0) {
                explicit_bzero(puVar12,(long)((session->remote).mac)->key_len);
                (*session->free)(puVar12,&session->abstract);
              }
            }
            pLVar16 = (session->local).comp;
            if (pLVar16 != (LIBSSH2_COMP_METHOD *)0x0) {
              if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                (*pLVar16->dtor)(session,1,&(session->local).comp_abstract);
                pLVar16 = (session->local).comp;
                if (pLVar16 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_0010df5f;
              }
              if (pLVar16->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                iVar8 = (*pLVar16->init)(session,1,&(session->local).comp_abstract);
                iVar2 = -5;
                if (iVar8 != 0) goto switchD_0010bad6_caseD_1;
              }
            }
LAB_0010df5f:
            pLVar16 = (session->remote).comp;
            iVar2 = 0;
            if (pLVar16 != (LIBSSH2_COMP_METHOD *)0x0) {
              if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                iVar2 = 0;
                (*pLVar16->dtor)(session,0,&(session->remote).comp_abstract);
                pLVar16 = (session->remote).comp;
                if (pLVar16 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_0010bad6_caseD_1;
              }
              iVar2 = 0;
              if (pLVar16->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                iVar2 = (*pLVar16->init)(session,0,&(session->remote).comp_abstract);
                iVar2 = (uint)(iVar2 == 0) * 5 + -5;
              }
            }
            goto switchD_0010bad6_caseD_1;
          }
          pcVar17 = "Timed out waiting for NEWKEYS ECDH";
        }
        else {
          pcVar17 = "Unable to send NEWKEYS message ECDH";
        }
      }
      else {
        pcVar17 = "Unexpected key length ECDH";
        iVar2 = -0xe;
      }
    }
    else {
      pcVar17 = "Unable to initialize hostkey importer ECDH";
LAB_0010bc07:
      iVar2 = -10;
    }
  }
  else {
    pcVar17 = "Unable to allocate memory for a copy of the host ECDH key";
LAB_0010bb25:
    iVar2 = -6;
  }
LAB_0010c77c:
  iVar2 = _libssh2_error(session,iVar2,pcVar17);
switchD_0010bad6_caseD_1:
  ecdh_exchange_state_cleanup(session,exchange_state);
  return iVar2;
LAB_0010cb84:
  (*session->free)(puVar12,&session->abstract);
  goto LAB_0010cb92;
LAB_0010cef7:
  (*session->free)(puVar13,&session->abstract);
  goto LAB_0010cf05;
LAB_0010d328:
  (*session->free)(puVar12,&session->abstract);
  goto LAB_0010d336;
LAB_0010d696:
  (*session->free)(puVar13,&session->abstract);
  goto LAB_0010d6a4;
LAB_0010dac1:
  (*session->free)(puVar12,&session->abstract);
  goto LAB_0010dacf;
LAB_0010de97:
  (*session->free)(puVar12,&session->abstract);
  goto LAB_0010dea5;
}

Assistant:

static int ecdh_sha2_nistp(LIBSSH2_SESSION *session, libssh2_curve_type type,
                           unsigned char *data, size_t data_len,
                           unsigned char *public_key,
                           size_t public_key_len, _libssh2_ec_key *private_key,
                           kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;

    if(data_len < 5) {
        ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                             "Host key data is too short");
        return ret;
    }

    if(exchange_state->state == libssh2_NB_state_idle) {

        /* Setup initial values */
        exchange_state->k = _libssh2_bn_init();

        exchange_state->state = libssh2_NB_state_created;
    }

    if(exchange_state->state == libssh2_NB_state_created) {
        /* parse INIT reply data */

        /* host key K_S */
        unsigned char *server_public_key;
        size_t server_public_key_len;
        struct string_buf buf;

        buf.data = data;
        buf.len = data_len;
        buf.dataptr = buf.data;
        buf.dataptr++; /* Advance past packet type */

        if(_libssh2_copy_string(session, &buf, &(session->server_hostkey),
                                &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host ECDH key");
            goto clean_exit;
        }

        session->server_hostkey_len = (uint32_t)server_public_key_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if(libssh2_md5_init(&fingerprint_ctx) &&
               libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                  session->server_hostkey_len) &&
               libssh2_md5_final(fingerprint_ctx,
                                 session->server_hostkey_md5)) {
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if(libssh2_sha1_init(&fingerprint_ctx) &&
               libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len) &&
               libssh2_sha1_final(fingerprint_ctx,
                                  session->server_hostkey_sha1)) {
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;
            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */

        /* SHA256 */
        {
            libssh2_sha256_ctx fingerprint_ctx;

            if(libssh2_sha256_init(&fingerprint_ctx) &&
               libssh2_sha256_update(fingerprint_ctx, session->server_hostkey,
                                     session->server_hostkey_len) &&
               libssh2_sha256_final(fingerprint_ctx,
                                    session->server_hostkey_sha256)) {
                session->server_hostkey_sha256_valid = TRUE;
            }
            else {
                session->server_hostkey_sha256_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char *base64Fingerprint = NULL;
            _libssh2_base64_encode(session,
                                   (const char *)
                                   session->server_hostkey_sha256,
                                   SHA256_DIGEST_LENGTH, &base64Fingerprint);
            if(base64Fingerprint) {
                _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                               "Server's SHA256 Fingerprint: %s",
                               base64Fingerprint));
                LIBSSH2_FREE(session, base64Fingerprint);
            }
        }
#endif /* LIBSSH2DEBUG */

        if(session->hostkey->init(session, session->server_hostkey,
                                  session->server_hostkey_len,
                                  &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer "
                                 "ECDH");
            goto clean_exit;
        }

        /* server public key Q_S */
        if(_libssh2_get_string(&buf, &server_public_key,
                               &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length ECDH");
            goto clean_exit;
        }

        /* server signature */
        if(_libssh2_get_string(&buf, &exchange_state->h_sig,
           &(exchange_state->h_sig_len))) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected ECDH server sig length");
            goto clean_exit;
        }

        /* Compute the shared secret K */
        rc = _libssh2_ecdh_gen_k(&exchange_state->k, private_key,
                                 server_public_key, server_public_key_len);
        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                 "Unable to create ECDH shared secret");
            goto clean_exit;
        }

        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
        LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if(!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for ECDH K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         (uint32_t)(exchange_state->k_value_len - 4));
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            if(_libssh2_bn_to_bin(exchange_state->k,
                                  exchange_state->k_value + 4)) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                                     "Can't write exchange_state->k");
                goto clean_exit;
            }
        }
        else {
            exchange_state->k_value[4] = 0;
            if(_libssh2_bn_to_bin(exchange_state->k,
                                  exchange_state->k_value + 5)) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                                     "Can't write exchange_state->e");
                goto clean_exit;
            }
        }

        /* verify hash */

        switch(type) {
            case LIBSSH2_EC_CURVE_NISTP256:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(256);
                break;
            case LIBSSH2_EC_CURVE_NISTP384:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(384);
                break;
            case LIBSSH2_EC_CURVE_NISTP521:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(512);
                break;
        }

        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature "
                                 "ECDH");
            goto clean_exit;
        }

        exchange_state->c = SSH_MSG_NEWKEYS;
        exchange_state->state = libssh2_NB_state_sent;
    }

    if(exchange_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send NEWKEYS message ECDH");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if(exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timed out waiting for NEWKEYS ECDH");
            goto clean_exit;
        }

        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Received NEWKEYS message ECDH"));

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if(!session->session_id) {

            size_t digest_length = 0;

            if(type == LIBSSH2_EC_CURVE_NISTP256)
                digest_length = SHA256_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP384)
                digest_length = SHA384_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP521)
                digest_length = SHA512_DIGEST_LENGTH;
            else{
                ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                     "Unknown SHA digest for EC curve");
                goto clean_exit;

            }
            session->session_id = LIBSSH2_ALLOC(session, digest_length);
            if(!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for "
                                     "SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   digest_length);
             session->session_id_len = (uint32_t)digest_length;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "session_id calculated"));
        }

        /* Cleanup any existing cipher */
        if(session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if(session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->local.crypt->
                                                 iv_len, "A");
            if(!iv) {
                ret = -1;
                goto clean_exit;
            }

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->local.crypt->
                                                 secret_len, "C");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated"));

        if(session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if(session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->remote.crypt->
                                                 iv_len, "B");

            if(!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->remote.crypt->
                                                 secret_len, "D");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated"));

        if(session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if(session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->local.mac->
                                                 key_len, "E");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated"));

        if(session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if(session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->remote.mac->
                                                 key_len, "F");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated"));

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if(session->local.comp && session->local.comp->init) {
            if(session->local.comp->init(session, 1,
                                         &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized"));

        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if(session->remote.comp && session->remote.comp->init) {
            if(session->remote.comp->init(session, 0,
                                          &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized"));
    }

clean_exit:
    ecdh_exchange_state_cleanup(session, exchange_state);

    return ret;
}